

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

LogicalXorLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_logicalxor(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  LogicalXorLayerParams *pLVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_logicalxor(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_logicalxor(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pLVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::LogicalXorLayerParams>(arena);
    (this->layer_).logicalxor_ = pLVar2;
  }
  return (LogicalXorLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::LogicalXorLayerParams* NeuralNetworkLayer::_internal_mutable_logicalxor() {
  if (!_internal_has_logicalxor()) {
    clear_layer();
    set_has_logicalxor();
    layer_.logicalxor_ = CreateMaybeMessage< ::CoreML::Specification::LogicalXorLayerParams >(GetArenaForAllocation());
  }
  return layer_.logicalxor_;
}